

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void envydis(disisa *isa,FILE *out,uint8_t *code,uint32_t start,int num,int vartype,int ptype,
            int quiet,label *labels,int labelsnum)

{
  char cVar1;
  char *pcVar2;
  int *piVar3;
  char **ppcVar4;
  uint32_t in_ECX;
  int iVar5;
  long in_RDX;
  FILE *in_RSI;
  disisa *in_RDI;
  uint32_t in_R8D;
  int in_R9D;
  bool bVar6;
  int in_stack_00000008;
  int in_stack_00000010;
  label *in_stack_00000018;
  int in_stack_00000020;
  int fl;
  int noblank;
  ull m_2 [2];
  ull a_2 [2];
  uint32_t val;
  int mark;
  int nonzero;
  int skip;
  int active;
  ull m_1 [2];
  ull a_1 [2];
  ull m [2];
  ull a [2];
  int active_1;
  int done;
  int j;
  int i;
  int cur;
  disctx *ctx;
  disctx c;
  char *in_stack_fffffffffffffde0;
  expr *in_stack_fffffffffffffde8;
  FILE *in_stack_fffffffffffffdf0;
  uint local_190;
  ulong local_158 [5];
  uint local_12c;
  uint local_128;
  int local_124;
  uint local_120;
  int local_11c;
  undefined1 local_118 [16];
  ulong local_108 [2];
  undefined1 local_f8 [16];
  ulong local_e8 [3];
  int local_cc;
  int local_c8;
  uint local_c4;
  uint local_c0;
  int local_bc;
  disctx *local_b8;
  undefined1 local_b0 [44];
  int in_stack_ffffffffffffff7c;
  void *in_stack_ffffffffffffff80;
  ull *in_stack_ffffffffffffff88;
  ull *in_stack_ffffffffffffff90;
  disctx *in_stack_ffffffffffffff98;
  
  memset(local_b0,0,0x88);
  local_b8 = (disctx *)local_b0;
  local_bc = 0;
  piVar3 = (int *)calloc((long)((int)(in_R8D + in_RDI->posunit + -1) / in_RDI->posunit),4);
  local_b8->marks = piVar3;
  ppcVar4 = (char **)calloc((long)((int)(in_R8D + in_RDI->posunit + -1) / in_RDI->posunit),8);
  local_b8->names = ppcVar4;
  local_b8->codebase = in_ECX;
  local_b8->codesz = in_R8D;
  local_b8->vartype = in_R9D;
  local_b8->ptype = in_stack_00000008;
  local_b8->isa = in_RDI;
  local_b8->labels = in_stack_00000018;
  local_b8->labelsnum = in_stack_00000020;
  if (in_stack_00000018 == (label *)0x0) {
    while (local_bc < (int)in_R8D) {
      memset(local_108,0,0x10);
      memset(local_118,0,0x10);
      for (local_c0 = 0; (int)local_c0 < 0x10 && (int)(local_bc + local_c0) < (int)in_R8D;
          local_c0 = local_c0 + 1) {
        local_108[(int)local_c0 / 8] =
             (ulong)*(byte *)(in_RDX + (int)(local_bc + local_c0)) << (sbyte)((local_c0 & 7) << 3) |
             local_108[(int)local_c0 / 8];
      }
      local_b8->oplen = 0;
      local_b8->pos = local_bc / in_RDI->posunit + in_ECX;
      atomtab(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
              in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      if (local_b8->oplen == 0) {
        local_bc = local_bc + 1;
      }
      else {
        local_bc = local_b8->oplen + local_bc;
      }
    }
  }
  else {
    for (local_c0 = 0; (int)local_c0 < in_stack_00000020; local_c0 = local_c0 + 1) {
      ::mark(local_b8,(uint32_t)in_stack_00000018[(int)local_c0].val,
             in_stack_00000018[(int)local_c0].type);
      if ((((ulong)local_b8->codebase <= in_stack_00000018[(int)local_c0].val) &&
          (in_stack_00000018[(int)local_c0].val < (ulong)(local_b8->codebase + local_b8->codesz)))
         && (in_stack_00000018[(int)local_c0].name != (char *)0x0)) {
        local_b8->names[in_stack_00000018[(int)local_c0].val - (ulong)local_b8->codebase] =
             in_stack_00000018[(int)local_c0].name;
      }
      if (in_stack_00000018[(int)local_c0].size != 0) {
        for (local_c4 = 0; local_c4 < in_stack_00000018[(int)local_c0].size; local_c4 = local_c4 + 4
            ) {
          ::mark(local_b8,(int)in_stack_00000018[(int)local_c0].val + local_c4,
                 in_stack_00000018[(int)local_c0].type);
        }
      }
    }
    do {
      local_c8 = 1;
      local_bc = 0;
      local_cc = 0;
      while (local_bc < (int)in_R8D) {
        if (((local_cc == 0) && ((local_b8->marks[local_bc / in_RDI->posunit] & 3U) != 0)) &&
           ((local_b8->marks[local_bc / in_RDI->posunit] & 8U) == 0)) {
          local_c8 = 0;
          local_cc = 1;
          iVar5 = local_bc / in_RDI->posunit;
          local_b8->marks[iVar5] = local_b8->marks[iVar5] | 8;
        }
        if (local_cc == 0) {
          local_bc = local_bc + 1;
        }
        else {
          memset(local_e8,0,0x10);
          memset(local_f8,0,0x10);
          for (local_c0 = 0; (int)local_c0 < 0x10 && (int)(local_bc + local_c0) < (int)in_R8D;
              local_c0 = local_c0 + 1) {
            local_e8[(int)local_c0 / 8] =
                 (ulong)*(byte *)(in_RDX + (int)(local_bc + local_c0)) <<
                 (sbyte)((local_c0 & 7) << 3) | local_e8[(int)local_c0 / 8];
          }
          local_b8->oplen = 0;
          local_b8->pos = local_bc / in_RDI->posunit + in_ECX;
          local_b8->endmark = 0;
          atomtab(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                  in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          if (((local_b8->oplen == 0) || (local_b8->endmark != 0)) ||
             ((local_b8->marks[local_bc / in_RDI->posunit] & 4U) != 0)) {
            local_cc = 0;
          }
          else {
            local_bc = local_b8->oplen + local_bc;
          }
        }
      }
    } while (local_c8 == 0);
  }
  local_bc = 0;
  local_11c = 0;
  local_120 = 0;
  local_124 = 0;
  while (local_bc < (int)in_R8D) {
    if (local_bc % in_RDI->posunit == 0) {
      local_190 = local_b8->marks[local_bc / in_RDI->posunit];
    }
    else {
      local_190 = 0;
    }
    local_128 = local_190;
    if ((local_bc % in_RDI->posunit == 0) &&
       (local_b8->names[local_bc / in_RDI->posunit] != (char *)0x0)) {
      if (local_120 != 0) {
        if (local_124 == 0) {
          fprintf(in_RSI,"%s[%x zero bytes skipped]\n",cnorm,(ulong)local_120);
        }
        else {
          fprintf(in_RSI,"%s[%x bytes skipped]\n",cunk,(ulong)local_120);
        }
        local_120 = 0;
        local_124 = 0;
      }
      if ((local_128 & 0x30) == 0) {
        if ((local_128 & 2) == 0) {
          if ((local_128 & 1) == 0) {
            fprintf(in_RSI,"%s%s:\n",cnorm,local_b8->names[local_bc / in_RDI->posunit]);
          }
          else {
            fprintf(in_RSI,"%s%s:\n",cbtarg,local_b8->names[local_bc / in_RDI->posunit]);
          }
        }
        else {
          fprintf(in_RSI,"\n%s%s:\n",cctarg,local_b8->names[local_bc / in_RDI->posunit]);
        }
      }
      else {
        fprintf(in_RSI,"%s%s:\n",cnorm,local_b8->names[local_bc / in_RDI->posunit]);
      }
    }
    if ((local_128 & 0x30) == 0) {
      if ((local_11c == 0) && ((local_128 & 7) != 0)) {
        local_11c = 1;
      }
      if ((local_11c == 0) && (in_stack_00000018 != (label *)0x0)) {
        if (*(char *)(in_RDX + local_bc) != '\0') {
          local_124 = 1;
        }
        local_bc = local_bc + 1;
        local_120 = local_120 + 1;
      }
      else {
        if (local_120 != 0) {
          if (local_124 == 0) {
            fprintf(in_RSI,"%s[%x zero bytes skipped]\n",cnorm,(ulong)local_120);
          }
          else {
            fprintf(in_RSI,"%s[%x bytes skipped]\n",cunk,(ulong)local_120);
          }
          local_120 = 0;
          local_124 = 0;
        }
        memset(local_158 + 2,0,0x10);
        memset(local_158,0,0x10);
        for (local_c0 = 0; (int)local_c0 < 0x10 && (int)(local_bc + local_c0) < (int)in_R8D;
            local_c0 = local_c0 + 1) {
          local_158[(long)((int)local_c0 / 8) + 2] =
               (ulong)*(byte *)(in_RDX + (int)(local_bc + local_c0)) << (sbyte)((local_c0 & 7) << 3)
               | local_158[(long)((int)local_c0 / 8) + 2];
        }
        local_b8->oplen = 0;
        local_b8->pos = local_bc / in_RDI->posunit + in_ECX;
        local_b8->atomsnum = 0;
        local_b8->endmark = 0;
        atomtab(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        if ((local_b8->endmark != 0) || ((local_128 & 4) != 0)) {
          local_11c = 0;
        }
        if (((local_128 & 2) != 0) && (local_b8->names[local_bc / in_RDI->posunit] == (char *)0x0))
        {
          fprintf(in_RSI,"\n",(long)local_bc % (long)in_RDI->posunit & 0xffffffff);
        }
        pcVar2 = cctarg;
        switch(local_128 & 3) {
        case 0:
          if (in_stack_00000010 == 0) {
            in_stack_fffffffffffffdf0 = (FILE *)cnorm;
            fprintf(in_RSI,"%s%08x:%s",cnorm,(ulong)(local_bc / in_RDI->posunit + in_ECX),cnorm);
          }
          break;
        case 1:
          in_stack_fffffffffffffde8 = (expr *)cbtarg;
          fprintf(in_RSI,"%s%08x:%s",cbtarg,(ulong)(local_bc / in_RDI->posunit + in_ECX),cnorm);
          break;
        case 2:
          fprintf(in_RSI,"%s%08x:%s",cctarg,(ulong)(local_bc / in_RDI->posunit + in_ECX),cnorm);
          in_stack_fffffffffffffde0 = pcVar2;
          break;
        case 3:
          fprintf(in_RSI,"%s%08x:%s",cbctarg,(ulong)(local_bc / in_RDI->posunit + in_ECX),cnorm);
        }
        if (in_stack_00000010 == 0) {
          for (local_c0 = 0; (int)local_c0 < in_RDI->maxoplen; local_c0 = in_RDI->opunit + local_c0)
          {
            fprintf(in_RSI," ");
            local_c4 = in_RDI->opunit;
            while (local_c4 = local_c4 - 1, -1 < (int)local_c4) {
              if ((local_c0 + local_c4 == 0) || ((int)(local_c0 + local_c4) < local_b8->oplen)) {
                if ((int)(local_bc + local_c0 + local_c4) < (int)in_R8D) {
                  fprintf(in_RSI,"%s%02x",cnorm,
                          (ulong)*(byte *)(in_RDX + (int)(local_bc + local_c0 + local_c4)));
                }
                else {
                  fprintf(in_RSI,"%s??",cunk);
                }
              }
              else {
                fprintf(in_RSI,"  ");
              }
            }
          }
          fprintf(in_RSI,"  ");
          if ((local_128 & 2) == 0) {
            fprintf(in_RSI," ");
          }
          else {
            fprintf(in_RSI,"%sC",cctarg);
          }
          if ((local_128 & 1) == 0) {
            fprintf(in_RSI," ");
          }
          else {
            fprintf(in_RSI,"%sB",cbtarg);
          }
        }
        else if ((in_stack_00000010 == 1) && (local_128 != 0)) {
          fprintf(in_RSI,"\n");
        }
        bVar6 = false;
        for (local_c0 = 0; (int)local_c0 < local_b8->atomsnum; local_c0 = local_c0 + 1) {
          if (local_b8->atoms[(int)local_c0]->type == EXPR_SEEND) {
            bVar6 = true;
          }
          if (((local_c0 != 0) || (in_stack_00000010 == 0)) && (!bVar6)) {
            fprintf(in_RSI," ");
          }
          printexpr(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                    (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
          bVar6 = local_b8->atoms[(int)local_c0]->type == EXPR_SESTART;
        }
        if (local_b8->oplen == 0) {
          fprintf(in_RSI," %s[unknown op length]%s",cunk,cnorm);
          local_bc = local_bc + 1;
        }
        else {
          bVar6 = false;
          for (local_c0 = local_b8->oplen; (int)local_c0 < 0x10; local_c0 = local_c0 + 1) {
            local_158[(long)((int)local_c0 / 8) + 2] =
                 (0xffL << (sbyte)((local_c0 & 7) << 3) ^ 0xffffffffffffffffU) &
                 local_158[(long)((int)local_c0 / 8) + 2];
          }
          for (local_c0 = 0; (int)local_c0 < 2; local_c0 = local_c0 + 1) {
            local_158[(long)(int)local_c0 + 2] =
                 (local_158[(int)local_c0] ^ 0xffffffffffffffff) &
                 local_158[(long)(int)local_c0 + 2];
            if (local_158[(long)(int)local_c0 + 2] != 0) {
              bVar6 = true;
            }
          }
          if (bVar6) {
            fprintf(in_RSI," %s[unknown:",cunk);
            for (local_c0 = 0; (int)local_c0 < local_b8->oplen || local_c0 == 0;
                local_c0 = in_RDI->opunit + local_c0) {
              fprintf(in_RSI," ");
              for (local_c4 = in_RDI->opunit - 1; -1 < (int)local_c4; local_c4 = local_c4 - 1) {
                if ((int)(local_bc + local_c0 + local_c4) < (int)in_R8D) {
                  fprintf(in_RSI,"%02llx",
                          local_158[(long)((int)(local_c0 + local_c4) / 8) + 2] >>
                          (sbyte)((local_c0 + local_c4 & 7) << 3) & 0xff);
                }
                else {
                  fprintf(in_RSI,"??");
                }
              }
            }
            fprintf(in_RSI,"]");
          }
          if ((int)in_R8D < local_bc + local_b8->oplen) {
            fprintf(in_RSI," %s[incomplete]%s",cunk,cnorm);
          }
          local_bc = local_b8->oplen + local_bc;
        }
        fprintf(in_RSI,"%s\n",cnorm);
      }
    }
    else {
      if (local_120 != 0) {
        if (local_124 == 0) {
          fprintf(in_RSI,"%s[%x zero bytes skipped]\n",cnorm,(ulong)local_120);
        }
        else {
          fprintf(in_RSI,"%s[%x bytes skipped]\n",cunk,(ulong)local_120);
        }
        local_120 = 0;
        local_124 = 0;
      }
      fprintf(in_RSI,"%s%08x:%s",cnum,(ulong)(local_bc / in_RDI->posunit + in_ECX),cnorm);
      if ((local_128 & 0x10) == 0) {
        fprintf(in_RSI," %s\"",cmem);
        for (; *(char *)(in_RDX + local_bc) != '\0'; local_bc = local_bc + 1) {
          cVar1 = *(char *)(in_RDX + local_bc);
          if (cVar1 == '\n') {
            fprintf(in_RSI,"\\n");
          }
          else if (cVar1 == '\"') {
            fprintf(in_RSI,"\\\"");
          }
          else if (cVar1 == '\\') {
            fprintf(in_RSI,"\\\\");
          }
          else {
            fprintf(in_RSI,"%c",(ulong)*(byte *)(in_RDX + local_bc));
          }
        }
        local_bc = local_bc + 1;
        fprintf(in_RSI,"\"\n");
      }
      else {
        local_12c = 0;
        for (local_c0 = 0; (int)local_c0 < 4 && (int)(local_bc + local_c0) < (int)in_R8D;
            local_c0 = local_c0 + 1) {
          local_12c = (uint)*(byte *)(in_RDX + (int)(local_bc + local_c0)) <<
                      ((byte)(local_c0 << 3) & 0x1f) | local_12c;
        }
        fprintf(in_RSI," %s%08x\n",cmem,(ulong)local_12c);
        local_bc = (int)(4 / (long)in_RDI->posunit) + local_bc;
      }
    }
  }
  free(local_b8->marks);
  return;
}

Assistant:

void envydis (const struct disisa *isa, FILE *out, uint8_t *code, uint32_t start, int num, int vartype, int ptype, int quiet, struct label *labels, int labelsnum)
{
	struct disctx c = { 0 };
	struct disctx *ctx = &c;
	int cur = 0, i, j;
	ctx->code8 = code;
	ctx->marks = calloc((num + isa->posunit - 1) / isa->posunit, sizeof *ctx->marks);
	ctx->names = calloc((num + isa->posunit - 1) / isa->posunit, sizeof *ctx->names);
	ctx->codebase = start;
	ctx->codesz = num;
	ctx->vartype = vartype;
	ctx->ptype = ptype;
	ctx->isa = isa;
	ctx->labels = labels;
	ctx->labelsnum = labelsnum;
	if (labels) {
		for (i = 0; i < labelsnum; i++) {
			mark(ctx, labels[i].val, labels[i].type);
			if (labels[i].val >= ctx->codebase && labels[i].val < ctx->codebase + ctx->codesz) {
				if (labels[i].name)
					ctx->names[labels[i].val - ctx->codebase] = labels[i].name;
			}
			if (labels[i].size) {
				for (j = 0; j < labels[i].size; j+=4)
					mark(ctx, labels[i].val + j, labels[i].type);
			}
		}
		int done;
		do {
			done = 1;
			cur = 0;
			int active = 0;
			while (cur < num) {
				if (!active && (ctx->marks[cur / isa->posunit] & 3) && !(ctx->marks[cur / isa->posunit] & 8)) {
					done = 0;
					active = 1;
					ctx->marks[cur / isa->posunit] |= 8;
				}
				if (active) {
					ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
					for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
						a[i/8] |= (ull)code[cur + i] << (i&7)*8;
					}
					ctx->oplen = 0;
					ctx->pos = cur / isa->posunit + start;
					ctx->endmark = 0;
					atomtab (ctx, a, m, isa->troot, 0);
					if (ctx->oplen && !ctx->endmark && !(ctx->marks[cur / isa->posunit] & 4))
						cur += ctx->oplen;
					else
						active = 0;
				} else {
					cur++;
				}
			}
		} while (!done);
	} else {
		while (cur < num) {
			ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
			for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
				a[i/8] |= (ull)code[cur + i] << (i&7)*8;
			}
			ctx->oplen = 0;
			ctx->pos = cur / isa->posunit + start;
			atomtab (ctx, a, m, isa->troot, 0);
			if (ctx->oplen)
				cur += ctx->oplen;
			else
				cur++;
		}
	}
	cur = 0;
	int active = 0;
	int skip = 0, nonzero = 0;
	while (cur < num) {
		int mark = (cur % isa->posunit ? 0 : ctx->marks[cur / isa->posunit]);
		if (!(cur % isa->posunit) && ctx->names[cur / isa->posunit]) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
				skip = 0;
				nonzero = 0;
			}
			if (mark & 0x30)
				fprintf (out, "%s%s:\n", cnorm, ctx->names[cur / isa->posunit]);
			else if (mark & 2)
				fprintf (out, "\n%s%s:\n", cctarg, ctx->names[cur / isa->posunit]);
			else if (mark & 1)
				fprintf (out, "%s%s:\n", cbtarg, ctx->names[cur / isa->posunit]);
			else
				fprintf (out, "%s%s:\n", cnorm, ctx->names[cur / isa->posunit]);
		}
		if (mark & 0x30) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
				skip = 0;
				nonzero = 0;
			}
			fprintf (out, "%s%08x:%s", cnum, cur / isa->posunit + start, cnorm);
			if (mark & 0x10) {
				uint32_t val = 0;
				for (i = 0; i < 4 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%08x\n", cmem, val);
				cur += 4 / isa->posunit;
			} else {
				fprintf (out, " %s\"", cmem);
				while (code[cur]) {
					switch (code[cur]) {
						case '\n':
							fprintf (out, "\\n");
							break;
						case '\\':
							fprintf (out, "\\\\");
							break;
						case '\"':
							fprintf (out, "\\\"");
							break;
						default:
							fprintf (out, "%c", code[cur]);
							break;
					}
					cur++;
				}
				cur++;
				fprintf (out, "\"\n");
			}
			continue;
		}
		if (!active && mark & 7)
			active = 1;
		if (!active && labels) {
			if (code[cur])
				nonzero = 1;
			cur++;
			skip++;
			continue;
		}
		if (skip) {
			if (nonzero)
				fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
			else
				fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
			skip = 0;
			nonzero = 0;
		}
		ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
		for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
			a[i/8] |= (ull)code[cur + i] << (i&7)*8;
		}
		ctx->oplen = 0;
		ctx->pos = cur / isa->posunit + start;
		ctx->atomsnum = 0;
		ctx->endmark = 0;
		atomtab (ctx, a, m, isa->troot, 0);

		if (ctx->endmark || mark & 4)
			active = 0;

		if (mark & 2 && !ctx->names[cur / isa->posunit])
			fprintf (out, "\n");
		switch (mark & 3) {
			case 0:
				if (!quiet)
					fprintf (out, "%s%08x:%s", cnorm, cur / isa->posunit + start, cnorm);
				break;
			case 1:
				fprintf (out, "%s%08x:%s", cbtarg, cur / isa->posunit + start, cnorm);
				break;
			case 2:
				fprintf (out, "%s%08x:%s", cctarg, cur / isa->posunit + start, cnorm);
				break;
			case 3:
				fprintf (out, "%s%08x:%s", cbctarg, cur / isa->posunit + start, cnorm);
				break;
		}

		if (!quiet) {
			for (i = 0; i < isa->maxoplen; i += isa->opunit) {
				fprintf (out, " ");
				for (j = isa->opunit - 1; j >= 0; j--)
					if (i+j && i+j >= ctx->oplen)
						fprintf (out, "  ");
					else if (cur+i+j >= num)
						fprintf (out, "%s??", cunk);
					else
						fprintf (out, "%s%02x", cnorm, code[cur + i + j]);
			}
			fprintf (out, "  ");

			if (mark & 2)
				fprintf (out, "%sC", cctarg);
			else
				fprintf (out, " ");
			if (mark & 1)
				fprintf (out, "%sB", cbtarg);
			else
				fprintf (out, " ");
		} else if (quiet == 1) {
			if (mark)
				fprintf (out, "\n");
		}

		int noblank = 0;

		for (i = 0; i < ctx->atomsnum; i++) {
			if (ctx->atoms[i]->type == EXPR_SEEND)
				noblank = 1;
			if ((i || !quiet) && !noblank)
				fprintf (out, " ");
			printexpr(out, ctx->atoms[i], 0);
			noblank = (ctx->atoms[i]->type == EXPR_SESTART);
		}

		if (ctx->oplen) {
			int fl = 0;
			for (i = ctx->oplen; i < MAXOPLEN * 8; i++)
				a[i/8] &= ~(0xffull << (i & 7) * 8);
			for (i = 0; i < MAXOPLEN; i++) {
				a[i] &= ~m[i];
				if (a[i])
					fl = 1;
			}
			if (fl) {
				fprintf (out, " %s[unknown:", cunk);
				for (i = 0; i < ctx->oplen || i == 0; i += isa->opunit) {
					fprintf (out, " ");
					for (j = isa->opunit - 1; j >= 0; j--)
						if (cur+i+j >= num)
							fprintf (out, "??");
						else
							fprintf (out, "%02llx", (a[(i+j)/8] >> ((i + j)&7) * 8) & 0xff);
				}
				fprintf (out, "]");
			}
			if (cur + ctx->oplen > num) {
				fprintf (out, " %s[incomplete]%s", cunk, cnorm);
			}
			cur += ctx->oplen;
		} else {
			fprintf (out, " %s[unknown op length]%s", cunk, cnorm);
			cur++;
		}
		fprintf (out, "%s\n", cnorm);
	}
	free(ctx->marks);
}